

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O3

void __thiscall CTB<TTA>::PerformLabeling(CTB<TTA> *this)

{
  long lVar1;
  undefined8 uVar2;
  int *piVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 uVar16;
  uint v;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar3,piVar3[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar21 = *(int *)&pMVar4->field_0x8;
  uVar22 = (ulong)iVar21;
  uVar17 = 1;
  if (0 < (long)uVar22) {
    uVar17 = *(uint *)&pMVar4->field_0xc;
    lVar9 = (long)(int)uVar17;
    uVar18 = 0;
    do {
      if (0 < (int)uVar17) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar23 = **(long **)&pMVar4->field_0x48;
        lVar26 = lVar23 * uVar18 + *(long *)&pMVar4->field_0x10;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar24 = lVar26 - lVar23;
        lVar23 = lVar23 + lVar26;
        lVar6 = *(long *)&pMVar5->field_0x10;
        lVar7 = **(long **)&pMVar5->field_0x48;
        lVar1 = lVar6 + lVar7 * uVar18;
        lVar19 = lVar1 - lVar7;
        lVar20 = lVar1 + lVar7;
        lVar10 = lVar7 + lVar1 + -4;
        uVar14 = uVar18 | 1;
        uVar16 = 0xffffffff;
        uVar15 = 0;
        iVar25 = -1;
        do {
          switch(uVar16) {
          case 1:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              if (uVar18 == 0) {
LAB_001b4283:
                uVar11 = (ulong)TTA::length_;
                TTA::rtable_[uVar11] = TTA::length_;
                TTA::next_[uVar11] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar13 = TTA::length_ + 1;
                *(uint *)(lVar1 + uVar15 * 4) = TTA::length_;
                TTA::length_ = uVar13;
LAB_001b42c7:
                iVar25 = 6;
              }
              else if (*(char *)(lVar24 + uVar15) == '\0') {
                if ((lVar9 <= (long)(uVar15 + 1)) || (*(char *)(lVar24 + uVar15 + 1) == '\0')) {
                  if ((uVar15 == 0) || (*(char *)((uVar15 - 1) + lVar24) == '\0'))
                  goto LAB_001b4283;
                  *(undefined4 *)(lVar1 + uVar15 * 4) = *(undefined4 *)(lVar19 + -4 + uVar15 * 4);
                  goto LAB_001b42c7;
                }
                uVar13 = *(uint *)(lVar19 + 4 + uVar15 * 4);
                *(uint *)(lVar1 + uVar15 * 4) = uVar13;
                iVar25 = 5;
                if ((uVar15 != 0) && (*(char *)((uVar15 - 1) + lVar24) != '\0')) {
                  TTA::Merge(uVar13,*(uint *)(lVar19 + -4 + uVar15 * 4));
                }
              }
              else {
                *(undefined4 *)(lVar1 + uVar15 * 4) = *(undefined4 *)(lVar19 + uVar15 * 4);
                iVar25 = 4;
              }
              uVar16 = 2;
              goto LAB_001b42d2;
            }
            uVar16 = 1;
            if ((uVar14 < uVar22) && (*(char *)(lVar23 + uVar15) != '\0')) {
              uVar11 = (ulong)TTA::length_;
              TTA::rtable_[uVar11] = TTA::length_;
              TTA::next_[uVar11] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar13 = TTA::length_ + 1;
              *(uint *)(lVar20 + uVar15 * 4) = TTA::length_;
              TTA::length_ = uVar13;
              uVar16 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar26 + uVar15) == '\0') goto LAB_001b3f0e;
            uVar16 = 2;
LAB_001b3ebd:
            if (iVar25 == 6) {
LAB_001b3f76:
              uVar13 = *(uint *)(lVar1 + -4 + uVar15 * 4);
              *(uint *)(lVar1 + uVar15 * 4) = uVar13;
              iVar25 = 6;
              if (uVar18 != 0) {
LAB_001b3f8e:
                iVar25 = 6;
                if (((long)(uVar15 + 1) < lVar9) && (*(char *)(lVar24 + uVar15 + 1) != '\0'))
                goto LAB_001b40b3;
              }
            }
            else if (iVar25 == 5) {
LAB_001b3f5d:
              *(undefined4 *)(lVar1 + uVar15 * 4) = *(undefined4 *)(lVar1 + -4 + uVar15 * 4);
              iVar25 = 5;
              uVar16 = 5;
            }
            else if (iVar25 == 4) {
              uVar13 = *(uint *)(lVar1 + -4 + uVar15 * 4);
              *(uint *)(lVar1 + uVar15 * 4) = uVar13;
              goto joined_r0x001b3ce6;
            }
LAB_001b42d2:
            if ((uVar14 < uVar22) && (*(char *)(lVar23 + uVar15) != '\0')) {
              *(undefined4 *)(lVar20 + uVar15 * 4) = *(undefined4 *)(lVar1 + uVar15 * 4);
            }
            break;
          case 3:
          case 7:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              if (uVar18 == 0) {
LAB_001b3f41:
                *(undefined4 *)(lVar1 + uVar15 * 4) = *(undefined4 *)(lVar10 + uVar15 * 4);
                iVar25 = 6;
              }
              else if (*(char *)(lVar24 + uVar15) == '\0') {
                if (((long)(uVar15 + 1) < lVar9) && (*(char *)(lVar24 + uVar15 + 1) != '\0')) {
LAB_001b4219:
                  uVar13 = *(uint *)(lVar19 + 4 + uVar15 * 4);
                  *(uint *)(lVar1 + uVar15 * 4) = uVar13;
                  TTA::Merge(uVar13,*(uint *)(lVar20 + (uVar15 - 1) * 4));
                  iVar25 = 5;
                  if ((uVar15 != 0) && (*(char *)(lVar24 + -1 + uVar15) != '\0')) {
                    TTA::Merge(*(uint *)(lVar1 + uVar15 * 4),*(uint *)(lVar19 + -4 + uVar15 * 4));
                  }
                }
                else {
                  iVar25 = 6;
                  uVar13 = *(uint *)(lVar20 + (uVar15 - 1) * 4);
                  *(uint *)(lVar1 + uVar15 * 4) = uVar13;
                  if ((uVar15 != 0) && (*(char *)(lVar24 + -1 + uVar15) != '\0')) {
                    v = *(uint *)(lVar19 + -4 + uVar15 * 4);
LAB_001b432d:
                    iVar25 = 6;
                    TTA::Merge(uVar13,v);
                  }
                }
              }
              else {
LAB_001b3e3e:
                uVar13 = *(uint *)(lVar19 + uVar15 * 4);
                *(uint *)(lVar1 + uVar15 * 4) = uVar13;
                TTA::Merge(uVar13,*(uint *)(lVar10 + uVar15 * 4));
                iVar25 = 4;
              }
LAB_001b3f53:
              uVar16 = 8;
              goto LAB_001b42d2;
            }
            goto LAB_001b3e82;
          case 4:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              uVar16 = 4;
              if (iVar25 == 6) goto LAB_001b3f76;
              if (iVar25 == 5) goto LAB_001b3f5d;
              if (iVar25 != 4) goto LAB_001b42d2;
              uVar13 = *(uint *)(lVar1 + -4 + uVar15 * 4);
              *(uint *)(lVar1 + uVar15 * 4) = uVar13;
joined_r0x001b3ce6:
              iVar25 = 6;
              uVar16 = 4;
              if (uVar18 != 0) {
                uVar16 = 4;
                if (*(char *)(lVar24 + uVar15) == '\0') goto LAB_001b3f8e;
                iVar25 = 4;
              }
              goto LAB_001b42d2;
            }
            goto LAB_001b3f0e;
          case 5:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              uVar13 = *(uint *)(lVar1 + -4 + uVar15 * 4);
              *(uint *)(lVar1 + uVar15 * 4) = uVar13;
              if (uVar18 == 0) {
LAB_001b407e:
                iVar25 = 6;
              }
              else {
                iVar25 = 4;
                if (*(char *)(lVar24 + uVar15) == '\0') {
                  if (lVar9 <= (long)(uVar15 + 1)) goto LAB_001b407e;
                  iVar25 = 6;
                  if (*(char *)(lVar24 + uVar15 + 1) != '\0') {
                    TTA::Merge(uVar13,*(uint *)(lVar19 + 4 + uVar15 * 4));
                    iVar25 = 5;
                  }
                }
              }
              uVar16 = 4;
              goto LAB_001b42d2;
            }
            goto LAB_001b3f0e;
          case 6:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              if (iVar25 == 6) {
                uVar13 = *(uint *)(lVar1 + -4 + uVar15 * 4);
                *(uint *)(lVar1 + uVar15 * 4) = uVar13;
                uVar16 = 6;
                if (((uVar18 == 0) || (lVar9 <= (long)(uVar15 + 1))) ||
                   (*(char *)(lVar24 + uVar15 + 1) == '\0')) {
                  iVar25 = 6;
                }
                else {
LAB_001b40b3:
                  TTA::Merge(uVar13,*(uint *)(lVar19 + 4 + uVar15 * 4));
                  iVar25 = 5;
                }
              }
              else {
                uVar16 = 6;
                if (iVar25 == 5) goto LAB_001b3f5d;
              }
              goto LAB_001b42d2;
            }
            goto LAB_001b3f0e;
          case 8:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              uVar16 = 8;
              goto LAB_001b3ebd;
            }
LAB_001b3f0e:
            uVar16 = 1;
            if ((uVar14 < uVar22) && (*(char *)(lVar23 + uVar15) != '\0')) {
              *(undefined4 *)(lVar20 + uVar15 * 4) =
                   *(undefined4 *)(lVar6 + lVar7 * uVar18 + -4 + uVar15 * 4);
LAB_001b3f37:
              uVar16 = 7;
            }
            break;
          case 9:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              if (uVar18 == 0) goto LAB_001b3f41;
              if (*(char *)(lVar24 + uVar15) != '\0') goto LAB_001b3e3e;
              if (((long)(uVar15 + 1) < lVar9) && (*(char *)(lVar24 + uVar15 + 1) != '\0'))
              goto LAB_001b4219;
              iVar25 = 6;
              lVar12 = uVar15 - 1;
              uVar13 = *(uint *)(lVar20 + lVar12 * 4);
              *(uint *)(lVar1 + uVar15 * 4) = uVar13;
              if ((uVar15 != 0) && (*(char *)(lVar24 + lVar12) != '\0')) {
                v = *(uint *)(lVar19 + lVar12 * 4);
                goto LAB_001b432d;
              }
              goto LAB_001b3f53;
            }
LAB_001b3e82:
            uVar16 = 1;
            if ((uVar14 < uVar22) && (*(char *)(lVar23 + uVar15) != '\0')) {
              *(undefined4 *)(lVar20 + uVar15 * 4) = *(undefined4 *)(lVar20 + -4 + uVar15 * 4);
              uVar16 = 9;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar26 + uVar15) != '\0') {
              if (uVar18 == 0) {
LAB_001b411a:
                uVar11 = (ulong)TTA::length_;
                TTA::rtable_[uVar11] = TTA::length_;
                TTA::next_[uVar11] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                iVar25 = 6;
                uVar13 = TTA::length_;
                TTA::length_ = TTA::length_ + 1;
              }
              else if (*(char *)(lVar24 + uVar15) == '\0') {
                if ((lVar9 <= (long)(uVar15 + 1)) || (*(char *)(lVar24 + uVar15 + 1) == '\0'))
                goto LAB_001b411a;
                iVar25 = 5;
                uVar13 = *(uint *)(lVar19 + 4 + uVar15 * 4);
              }
              else {
                iVar25 = 4;
                uVar13 = *(uint *)(lVar19 + uVar15 * 4);
              }
              *(uint *)(lVar1 + uVar15 * 4) = uVar13;
              uVar16 = 2;
              if ((uVar14 < uVar22) && (*(char *)(lVar23 + uVar15) != '\0')) {
                *(uint *)(lVar20 + uVar15 * 4) = uVar13;
              }
              break;
            }
            uVar16 = 1;
            if ((uVar22 <= uVar14) || (*(char *)(lVar23 + uVar15) == '\0')) break;
            uVar11 = (ulong)TTA::length_;
            TTA::rtable_[uVar11] = TTA::length_;
            TTA::next_[uVar11] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar13 = TTA::length_ + 1;
            *(uint *)(lVar20 + uVar15 * 4) = TTA::length_;
            TTA::length_ = uVar13;
            goto LAB_001b3f37;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar17);
      }
      puVar8 = TTA::rtable_;
      uVar18 = uVar18 + 2;
    } while ((int)uVar18 < iVar21);
    uVar17 = 1;
    if (1 < TTA::length_) {
      uVar22 = 1;
      do {
        if (uVar22 == puVar8[uVar22]) {
          uVar17 = uVar17 + 1;
          uVar13 = uVar17;
        }
        else {
          uVar13 = puVar8[puVar8[uVar22]];
        }
        puVar8[uVar22] = uVar13;
        uVar22 = uVar22 + 1;
      } while (uVar22 < TTA::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar17;
  puVar8 = TTA::rtable_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar21 = *(int *)&pMVar5->field_0x8;
  if (0 < iVar21) {
    lVar9 = *(long *)&pMVar5->field_0x10;
    lVar1 = **(long **)&pMVar5->field_0x48;
    lVar20 = 0;
    do {
      iVar25 = *(int *)&pMVar5->field_0xc;
      if ((long)iVar25 != 0) {
        lVar23 = 0;
        do {
          *(uint *)(lVar9 + lVar23) = puVar8[*(uint *)(lVar9 + lVar23)];
          lVar23 = lVar23 + 4;
        } while ((long)iVar25 * 4 != lVar23);
        iVar21 = *(int *)&pMVar5->field_0x8;
      }
      lVar20 = lVar20 + 1;
      lVar9 = lVar9 + lVar1;
    } while (lVar20 < iVar21);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }